

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O1

void color_Source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  long lVar5;
  bool bVar6;
  short sVar7;
  short sVar9;
  undefined1 auVar8 [16];
  int iVar10;
  undefined1 auVar13 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  
  if (const_alpha == 0xff) {
    memfill32(dest,color,length);
    return;
  }
  uVar3 = 0xff - const_alpha;
  uVar2 = (color & 0xff00ff) * const_alpha >> 8 & 0xff00ff |
          (color >> 8 & 0xff00ff) * const_alpha & 0xff00ff00;
  auVar8 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
  auVar1 = _DAT_001411c0;
  if (length != 0 && ((ulong)dest & 0xf) != 0) {
    puVar4 = dest + 1;
    iVar10 = length;
    do {
      *dest = ((*dest & 0xff00ff) * uVar3 >> 8 & 0xff00ff) + uVar2 +
              ((*dest >> 8 & 0xff00ff) * uVar3 & 0xff00ff00);
      dest = dest + 1;
      length = iVar10 + -1;
      auVar1 = _DAT_001411c0;
      if (((ulong)puVar4 & 0xf) == 0) break;
      puVar4 = puVar4 + 1;
      bVar6 = iVar10 != 1;
      iVar10 = length;
    } while (bVar6);
  }
  do {
    if (length - 1U < 3) {
      *dest = ((*dest & 0xff00ff) * uVar3 >> 8 & 0xff00ff) + uVar2 +
              ((*dest >> 8 & 0xff00ff) * uVar3 & 0xff00ff00);
      iVar10 = -1;
      lVar5 = 4;
    }
    else {
      if (length == 0) {
        return;
      }
      sVar7 = auVar8._0_2_;
      auVar13._0_2_ = ((ushort)*dest >> 8) * sVar7;
      sVar9 = auVar8._2_2_;
      auVar13._2_2_ = (*(ushort *)((long)dest + 2) >> 8) * sVar9;
      auVar13._4_2_ = ((ushort)dest[1] >> 8) * sVar7;
      auVar13._6_2_ = (*(ushort *)((long)dest + 6) >> 8) * sVar9;
      auVar13._8_2_ = ((ushort)dest[2] >> 8) * sVar7;
      auVar13._10_2_ = (*(ushort *)((long)dest + 10) >> 8) * sVar9;
      auVar13._12_2_ = ((ushort)dest[3] >> 8) * sVar7;
      auVar13._14_2_ = (*(ushort *)((long)dest + 0xe) >> 8) * sVar9;
      auVar13 = auVar13 & auVar1;
      iVar10 = CONCAT22((ushort)((*(ushort *)((long)dest + 2) & 0xff) * sVar9) >> 8,
                        (ushort)(((ushort)*dest & 0xff) * sVar7) >> 8);
      auVar11._0_8_ =
           CONCAT26((ushort)((*(ushort *)((long)dest + 6) & 0xff) * sVar9) >> 8,
                    CONCAT24((ushort)(((ushort)dest[1] & 0xff) * sVar7) >> 8,iVar10));
      auVar11._8_2_ = (ushort)(((ushort)dest[2] & 0xff) * sVar7) >> 8;
      auVar11._10_2_ = (ushort)((*(ushort *)((long)dest + 10) & 0xff) * sVar9) >> 8;
      auVar12._12_2_ = (ushort)(((ushort)dest[3] & 0xff) * sVar7) >> 8;
      auVar12._0_12_ = auVar11;
      auVar12._14_2_ = (ushort)((*(ushort *)((long)dest + 0xe) & 0xff) * sVar9) >> 8;
      *dest = iVar10 + uVar2 + auVar13._0_4_;
      dest[1] = (int)((ulong)auVar11._0_8_ >> 0x20) + uVar2 + auVar13._4_4_;
      dest[2] = auVar11._8_4_ + uVar2 + auVar13._8_4_;
      dest[3] = auVar12._12_4_ + uVar2 + auVar13._12_4_;
      iVar10 = -4;
      lVar5 = 0x10;
    }
    dest = (uint32_t *)((long)dest + lVar5);
    length = length + iVar10;
  } while( true );
}

Assistant:

static void color_Source(uint32_t *dest, int length, uint32_t color,
                         uint32_t alpha)
{
    int ialpha, i;

    if (alpha == 255) {
        memfill32(dest, color, length);
    } else {
        ialpha = 255 - alpha;
        color = BYTE_MUL(color, alpha);
        for (i = 0; i < length; ++i)
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}